

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O3

pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
 __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,ImputedData<long,double>>,tsl::robin_map<unsigned_long,ImputedData<long,double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,ImputedData<long,double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
::
insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
          (robin_hash<std::pair<unsigned_long,ImputedData<long,double>>,tsl::robin_map<unsigned_long,ImputedData<long,double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,ImputedData<long,double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
           *this,unsigned_long *key,piecewise_construct_t *value_type_args,
          tuple<const_unsigned_long_&> *value_type_args_1,tuple<> *value_type_args_2)

{
  ulong uVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  short curr_dist_from_ideal_bucket;
  distance_type *pdVar4;
  long lVar5;
  robin_iterator<false> rVar6;
  long lVar7;
  ulong ibucket;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar8;
  value_type local_128;
  
  uVar1 = *key;
  lVar7 = *(long *)(this + 0x20);
  ibucket = uVar1 & *(ulong *)this;
  lVar5 = ibucket * 0x100;
  if (*(short *)(lVar7 + lVar5) < 0) {
    curr_dist_from_ideal_bucket = 0;
  }
  else {
    curr_dist_from_ideal_bucket = 0;
    do {
      rVar6.m_bucket = (bucket_entry_ptr)(lVar5 + lVar7);
      if (*(ulong *)(rVar6.m_bucket)->m_value == uVar1) {
        uVar3 = 0;
        goto LAB_001dc260;
      }
      curr_dist_from_ideal_bucket = curr_dist_from_ideal_bucket + 1;
      ibucket = ibucket + 1 & *(ulong *)this;
      lVar5 = ibucket * 0x100;
    } while (curr_dist_from_ideal_bucket <= *(short *)(lVar7 + lVar5));
  }
  while (bVar2 = robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 ::rehash_on_extreme_load
                           ((robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                             *)this,curr_dist_from_ideal_bucket), bVar2) {
    ibucket = uVar1 & *(ulong *)this;
    if (*(short *)(*(long *)(this + 0x20) + ibucket * 0x100) < 0) {
      curr_dist_from_ideal_bucket = 0;
    }
    else {
      curr_dist_from_ideal_bucket = 0;
      do {
        curr_dist_from_ideal_bucket = curr_dist_from_ideal_bucket + 1;
        ibucket = ibucket + 1 & *(ulong *)this;
      } while (curr_dist_from_ideal_bucket <= *(short *)(*(long *)(this + 0x20) + ibucket * 0x100));
    }
  }
  lVar7 = ibucket * 0x100;
  if (*(short *)(*(long *)(this + 0x20) + lVar7) == -1) {
    pdVar4 = (distance_type *)(*(long *)(this + 0x20) + lVar7);
    *(unsigned_long *)(pdVar4 + 4) =
         *(value_type_args_1->super__Tuple_impl<0UL,_const_unsigned_long_&>).
          super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl;
    memset(pdVar4 + 8,0,0xd8);
    *pdVar4 = curr_dist_from_ideal_bucket;
    uVar3 = extraout_RDX_00;
  }
  else {
    local_128.first =
         *(value_type_args_1->super__Tuple_impl<0UL,_const_unsigned_long_&>).
          super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl;
    memset(&local_128.second,0,0xd8);
    robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
    ::insert_value_impl((robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                         *)this,ibucket,curr_dist_from_ideal_bucket,(truncated_hash_type)uVar1,
                        &local_128);
    ImputedData<long,_double>::~ImputedData(&local_128.second);
    uVar3 = extraout_RDX;
  }
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
  rVar6.m_bucket = (bucket_entry_ptr)(lVar7 + *(long *)(this + 0x20));
  uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
LAB_001dc260:
  pVar8._8_8_ = uVar3;
  pVar8.first.m_bucket = rVar6.m_bucket;
  return pVar8;
}

Assistant:

std::pair<iterator, bool> insert_impl(const K& key,
                                        Args&&... value_type_args) {
    const std::size_t hash = hash_key(key);

    std::size_t ibucket = bucket_for_hash(hash);
    distance_type dist_from_ideal_bucket = 0;

    while (dist_from_ideal_bucket <=
           m_buckets[ibucket].dist_from_ideal_bucket()) {
      if ((!USE_STORED_HASH_ON_LOOKUP ||
           m_buckets[ibucket].bucket_hash_equal(hash)) &&
          compare_keys(KeySelect()(m_buckets[ibucket].value()), key)) {
        return std::make_pair(iterator(m_buckets + ibucket), false);
      }

      ibucket = next_bucket(ibucket);
      dist_from_ideal_bucket++;
    }

    while (rehash_on_extreme_load(dist_from_ideal_bucket)) {
      ibucket = bucket_for_hash(hash);
      dist_from_ideal_bucket = 0;

      while (dist_from_ideal_bucket <=
             m_buckets[ibucket].dist_from_ideal_bucket()) {
        ibucket = next_bucket(ibucket);
        dist_from_ideal_bucket++;
      }
    }

    if (m_buckets[ibucket].empty()) {
      m_buckets[ibucket].set_value_of_empty_bucket(
          dist_from_ideal_bucket, bucket_entry::truncate_hash(hash),
          std::forward<Args>(value_type_args)...);
    } else {
      insert_value(ibucket, dist_from_ideal_bucket,
                   bucket_entry::truncate_hash(hash),
                   std::forward<Args>(value_type_args)...);
    }

    m_nb_elements++;
    /*
     * The value will be inserted in ibucket in any case, either because it was
     * empty or by stealing the bucket (robin hood).
     */
    return std::make_pair(iterator(m_buckets + ibucket), true);
  }